

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O1

void V_CalcCleanFacs(int designwidth,int designheight,int realwidth,int realheight,int *cleanx,
                    int *cleany,int *_cx1,int *_cx2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  float aspect;
  
  aspect = ActiveRatio(realwidth,realheight,(float *)0x0);
  iVar3 = AspectMultiplier(aspect);
  if (1.333 <= aspect) {
    iVar3 = (iVar3 * realwidth) / 0x30;
    iVar4 = realheight;
  }
  else {
    iVar4 = (iVar3 * realheight) / 0x30;
    iVar3 = realwidth;
  }
  iVar3 = iVar3 / designwidth;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  iVar4 = iVar4 / designheight;
  if (iVar4 < 2) {
    iVar4 = 1;
  }
  iVar5 = realwidth / designwidth;
  if (iVar5 < 2) {
    iVar5 = 1;
  }
  iVar8 = 1;
  if (1 < realheight / designheight) {
    iVar8 = realheight / designheight;
  }
  uVar6 = iVar3 - iVar4;
  uVar1 = -uVar6;
  if (0 < (int)uVar6) {
    uVar1 = uVar6;
  }
  uVar7 = iVar5 - iVar8;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  iVar2 = iVar5;
  if (uVar1 <= uVar6) {
    iVar8 = iVar4;
    iVar2 = iVar3;
  }
  *cleanx = iVar2;
  *cleany = iVar8;
  if (*cleanx < iVar8) {
    *cleany = *cleanx;
  }
  else {
    *cleanx = iVar8;
  }
  if (_cx1 != (int *)0x0) {
    *_cx1 = iVar3;
  }
  if (_cx2 != (int *)0x0) {
    *_cx2 = iVar5;
  }
  return;
}

Assistant:

void V_CalcCleanFacs (int designwidth, int designheight, int realwidth, int realheight, int *cleanx, int *cleany, int *_cx1, int *_cx2)
{
	float ratio;
	int cwidth;
	int cheight;
	int cx1, cy1, cx2, cy2;

	ratio = ActiveRatio(realwidth, realheight);
	if (AspectTallerThanWide(ratio))
	{
		cwidth = realwidth;
		cheight = realheight * AspectMultiplier(ratio) / 48;
	}
	else
	{
		cwidth = realwidth * AspectMultiplier(ratio) / 48;
		cheight = realheight;
	}
	// Use whichever pair of cwidth/cheight or width/height that produces less difference
	// between CleanXfac and CleanYfac.
	cx1 = MAX(cwidth / designwidth, 1);
	cy1 = MAX(cheight / designheight, 1);
	cx2 = MAX(realwidth / designwidth, 1);
	cy2 = MAX(realheight / designheight, 1);
	if (abs(cx1 - cy1) <= abs(cx2 - cy2))
	{ // e.g. 640x360 looks better with this.
		*cleanx = cx1;
		*cleany = cy1;
	}
	else
	{ // e.g. 720x480 looks better with this.
		*cleanx = cx2;
		*cleany = cy2;
	}

	if (*cleanx < *cleany)
		*cleany = *cleanx;
	else
		*cleanx = *cleany;

	if (_cx1 != NULL)	*_cx1 = cx1;
	if (_cx2 != NULL)	*_cx2 = cx2;
}